

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8AllCertificatesAnyPolicyTest11Subpart2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section8AllCertificatesAnyPolicyTest11Subpart2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.8.11";
  local_88.should_validate = true;
  PkitsTestInfo::SetInitialPolicySet(&local_88,"NIST-test-policy-1");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)&DAT_006cafd0,
             (char *(*) [3])&PTR_anon_var_dwarf_3fc361_006cb400,&local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8AllCertificatesAnyPolicyTest11Subpart2) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "anyPolicyCACert",
                               "AllCertificatesanyPolicyTest11EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "anyPolicyCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.11";
  info.should_validate = true;
  info.SetInitialPolicySet("NIST-test-policy-1");

  this->RunTest(certs, crls, info);
}